

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_topology.cpp
# Opt level: O2

int ON__MeshFaceSide_compare_m_vi(ON_MeshFaceSide *side1,ON_MeshFaceSide *side2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  if (side1->m_vi[0] < side2->m_vi[0]) {
    return iVar1;
  }
  iVar2 = 1;
  if (side1->m_vi[0] <= side2->m_vi[0]) {
    if (side1->m_vi[1] < side2->m_vi[1]) {
      return iVar1;
    }
    if (side1->m_vi[1] <= side2->m_vi[1]) {
      if (side1->m_fi < side2->m_fi) {
        return iVar1;
      }
      if (side1->m_fi <= side2->m_fi) {
        if (side1->m_side < side2->m_side) {
          return iVar1;
        }
        if (side1->m_side <= side2->m_side) {
          iVar2 = iVar1;
          if (side2->m_dir <= side1->m_dir) {
            return (int)(side2->m_dir < side1->m_dir);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ON_SORT_TEMPLATE_COMPARE( 
        ON_SORT_TEMPLATE_TYPE const * side1, 
        ON_SORT_TEMPLATE_TYPE const * side2 
        )
{
  if ( side1->m_vi[0] < side2->m_vi[0] )
    return -1;
  if ( side1->m_vi[0] > side2->m_vi[0] )
    return 1;
  if ( side1->m_vi[1] < side2->m_vi[1] )
    return -1;
  if ( side1->m_vi[1] > side2->m_vi[1] )
    return 1;
  if ( side1->m_fi < side2->m_fi )
    return -1;
  if ( side1->m_fi > side2->m_fi )
    return 1;
  if ( side1->m_side < side2->m_side )
    return -1;
  if ( side1->m_side > side2->m_side )
    return 1;
  if ( side1->m_dir < side2->m_dir )
    return -1;
  if ( side1->m_dir > side2->m_dir )
    return 1;
  return 0;
}